

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O2

void __thiscall Image::Image(Image *this,string *filename)

{
  bool bVar1;
  float *pfVar2;
  undefined8 *puVar3;
  int n;
  string ext;
  
  suffix(&ext,filename);
  github111116::ConsoleLogger::log<char[15],std::__cxx11::string>
            (&console,(char (*) [15])"Loading image:",filename);
  bVar1 = std::operator==(&ext,"exr");
  if (bVar1) {
    LoadEXR_RGB(&this->pixels,&this->w,&this->h,(filename->_M_dataplus)._M_p);
  }
  else {
    bVar1 = std::operator==(&ext,"hdr");
    if (!bVar1) {
      bVar1 = std::operator==(&ext,"png");
      if (!bVar1) {
        bVar1 = std::operator==(&ext,"jpg");
        if (!bVar1) {
          puVar3 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar3 = "Image load: unrecognized format";
          __cxa_throw(puVar3,&char_const*::typeinfo,0);
        }
      }
    }
    pfVar2 = stbi_loadf((filename->_M_dataplus)._M_p,&this->w,&this->h,&n,3);
    this->pixels = pfVar2;
  }
  std::__cxx11::string::~string((string *)&ext);
  return;
}

Assistant:

Image(const std::string& filename) {
		std::string ext = suffix(filename);
		console.log("Loading image:", filename);
		if (ext == "exr") {
			LoadEXR_RGB(&pixels, &w, &h, filename.c_str());
			return;
		}
		if (ext == "hdr" || ext == "png" || ext == "jpg") {
			int n;
			pixels = stbi_loadf(filename.c_str(), &w, &h, &n, 3);
			return;
		}
		throw "Image load: unrecognized format";
	}